

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

WhereTerm *
whereScanInit(WhereScan *pScan,WhereClause *pWC,int iCur,int iColumn,u32 opMask,Index *pIdx)

{
  WhereTerm *pWVar1;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long in_R9;
  int j;
  int local_20;
  WhereScan *in_stack_fffffffffffffff8;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RSI;
  in_RDI[3] = 0;
  *(undefined1 *)(in_RDI + 4) = 0;
  in_RDI[2] = 0;
  if (in_R9 == 0) {
    local_20 = in_ECX;
    if (in_ECX == -2) {
      return (WhereTerm *)0x0;
    }
  }
  else {
    local_20 = (int)*(short *)(*(long *)(in_R9 + 8) + (long)in_ECX * 2);
    if (local_20 == -2) {
      in_RDI[3] = *(undefined8 *)(*(long *)(in_R9 + 0x50) + 8 + (long)in_ECX * 0x20);
      in_RDI[2] = *(undefined8 *)(*(long *)(in_R9 + 0x40) + (long)in_ECX * 8);
    }
    else if (local_20 == *(short *)(*(long *)(in_R9 + 0x18) + 0x44)) {
      local_20 = -1;
    }
    else if (-1 < local_20) {
      *(undefined1 *)(in_RDI + 4) =
           *(undefined1 *)(*(long *)(*(long *)(in_R9 + 0x18) + 8) + (long)local_20 * 0x20 + 0x19);
      in_RDI[2] = *(undefined8 *)(*(long *)(in_R9 + 0x40) + (long)in_ECX * 8);
    }
  }
  *(undefined4 *)((long)in_RDI + 0x24) = in_R8D;
  *(undefined4 *)(in_RDI + 5) = 0;
  *(undefined4 *)((long)in_RDI + 0x2c) = in_EDX;
  *(short *)(in_RDI + 0xb) = (short)local_20;
  *(undefined1 *)((long)in_RDI + 0x21) = 1;
  *(undefined1 *)((long)in_RDI + 0x22) = 1;
  pWVar1 = whereScanNext(in_stack_fffffffffffffff8);
  return pWVar1;
}

Assistant:

static WhereTerm *whereScanInit(
  WhereScan *pScan,       /* The WhereScan object being initialized */
  WhereClause *pWC,       /* The WHERE clause to be scanned */
  int iCur,               /* Cursor to scan for */
  int iColumn,            /* Column to scan for */
  u32 opMask,             /* Operator(s) to scan for */
  Index *pIdx             /* Must be compatible with this index */
){
  pScan->pOrigWC = pWC;
  pScan->pWC = pWC;
  pScan->pIdxExpr = 0;
  pScan->idxaff = 0;
  pScan->zCollName = 0;
  if( pIdx ){
    int j = iColumn;
    iColumn = pIdx->aiColumn[j];
    if( iColumn==XN_EXPR ){
      pScan->pIdxExpr = pIdx->aColExpr->a[j].pExpr;
      pScan->zCollName = pIdx->azColl[j];
    }else if( iColumn==pIdx->pTable->iPKey ){
      iColumn = XN_ROWID;
    }else if( iColumn>=0 ){
      pScan->idxaff = pIdx->pTable->aCol[iColumn].affinity;
      pScan->zCollName = pIdx->azColl[j];
    }
  }else if( iColumn==XN_EXPR ){
    return 0;
  }
  pScan->opMask = opMask;
  pScan->k = 0;
  pScan->aiCur[0] = iCur;
  pScan->aiColumn[0] = iColumn;
  pScan->nEquiv = 1;
  pScan->iEquiv = 1;
  return whereScanNext(pScan);
}